

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::SwizzleOp::evaluate(SwizzleOp *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  int outElemNdx;
  long lVar2;
  ExecValueAccess outValue;
  ExecConstValueAccess inValue;
  ConstStridedValueAccess<64> local_70;
  ConstStridedValueAccess<64> local_60;
  StridedValueAccess<64> local_50;
  ConstStridedValueAccess<64> local_40;
  
  (*this->m_child->_vptr_Expression[4])();
  iVar1 = (*this->m_child->_vptr_Expression[5])();
  local_40.m_type = (VariableType *)CONCAT44(extraout_var,iVar1);
  local_50.super_ConstStridedValueAccess<64>.m_type = &(this->m_outValueRange).m_type;
  local_50.super_ConstStridedValueAccess<64>.m_value =
       (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
       .super__Vector_impl_data._M_start;
  for (lVar2 = 0; lVar2 < (local_50.super_ConstStridedValueAccess<64>.m_type)->m_numElements;
      lVar2 = lVar2 + 1) {
    local_60 = ConstStridedValueAccess<64>::component(&local_40,(uint)this->m_swizzle[lVar2]);
    local_70 = (ConstStridedValueAccess<64>)StridedValueAccess<64>::component(&local_50,(int)lVar2);
    StridedValueAccess<64>::operator=
              ((StridedValueAccess<64> *)&local_70,(StridedValueRead<64> *)&local_60);
  }
  return;
}

Assistant:

void SwizzleOp::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	inValue		= m_child->getValue();
	ExecValueAccess			outValue	= m_value.getValue(m_outValueRange.getType());

	for (int outElemNdx = 0; outElemNdx < outValue.getType().getNumElements(); outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		outValue.component(outElemNdx) = inValue.component(inElemNdx).value();
	}
}